

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O2

void PatchHandleArchipelago::add_proc_handle_archipelago_items_on_ground(ROM *rom)

{
  uint32_t address;
  Code *pCVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  initializer_list<md::AddressRegister> __l_03;
  allocator_type local_16a;
  allocator_type local_169;
  _Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> local_168;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_150;
  undefined1 local_138 [24];
  undefined5 uStack_120;
  undefined3 uStack_11b;
  _Rb_tree_node_base local_118;
  size_t local_f8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_f0;
  AddressRegister local_b8;
  Code proc;
  
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  proc._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  proc._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  proc._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &proc._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00246bf0;
  proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       proc._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       proc._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::cmpib(&proc,'\x7f',(Param *)local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"not_archipelago",(allocator<char> *)&local_168);
  md::Code::bne(&proc,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  local_168._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_168._M_impl.super__Vector_impl_data._M_start._2_6_,0x500);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_168;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,__l,
             (allocator_type *)&local_150);
  md::Code::trap(&proc,'\0',(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  local_138[8] = 7;
  local_138._0_8_ = &PTR_getXn_00246bf0;
  md::Code::clrw(&proc,(Param *)local_138);
  local_138._0_8_ = &PTR_getXn_00246d28;
  local_138[0x10] = 5;
  local_138._8_8_ = &PTR_getXn_00246c60;
  uStack_120._0_3_ = 0x2003a;
  local_168._M_impl.super__Vector_impl_data._M_finish._0_1_ = 7;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::moveb(&proc,(Param *)local_138,(Param *)&local_168);
  local_138[8] = '\a';
  local_138._0_8_ = &PTR_getXn_00246bf0;
  md::Code::lsrb(&proc,'\x02',(DataRegister *)local_138);
  local_138[8] = '\0';
  local_138._0_8_ = &PTR_getXn_00246bf0;
  uStack_120._0_1_ = 7;
  local_138._16_8_ = &PTR_getXn_00246bf0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_138;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_168,__l_00,
             &local_169);
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_01._M_len = 1;
  __l_01._M_array = &local_b8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_150,__l_01,
             &local_16a);
  md::Code::movem_to_stack
            (&proc,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_168,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_150);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_150);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_168);
  local_138[8] = '\a';
  local_138._0_8_ = &PTR_getXn_00246bf0;
  local_168._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::movel(&proc,(Param *)local_138,(Param *)&local_168);
  local_138[8] = '\a';
  local_138._0_8_ = &PTR_getXn_00246bf0;
  md::Code::andib(&proc,'\a',(Param *)local_138);
  local_138[8] = '\0';
  local_138._0_8_ = &PTR_getXn_00246bf0;
  md::Code::lsrb(&proc,'\x03',(DataRegister *)local_138);
  local_138._8_8_ = (ulong)(uint7)local_138._9_7_ << 8;
  local_138._0_8_ = &PTR_getXn_00246c60;
  md::Code::lea(&proc,0xff1060,(AddressRegister *)local_138);
  local_168._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_168._M_impl.super__Vector_impl_data._M_finish._1_7_,7);
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  local_150._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_150._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_138._0_8_ = &PTR_getXn_00246d68;
  uStack_120 = 2;
  local_138._8_8_ = &local_150;
  local_138._16_8_ = &local_b8;
  md::Code::bset(&proc,(DataRegister *)&local_168,(Param *)local_138);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00246bf0;
  uStack_120._0_1_ = 7;
  local_138._16_8_ = &PTR_getXn_00246bf0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_138;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_168,__l_02,
             &local_169);
  local_b8.super_Register._code = '\0';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_03._M_len = 1;
  __l_03._M_array = &local_b8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_150,__l_03,
             &local_16a);
  md::Code::movem_from_stack
            (&proc,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_168,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_150);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_150);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_168);
  local_138[8] = '\a';
  local_138._0_8_ = &PTR_getXn_00246bf0;
  md::Code::addiw(&proc,0x200,(Param *)local_138);
  local_138[8] = '\a';
  local_138._0_8_ = &PTR_getXn_00246bf0;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x200ff0026;
  md::Code::movew(&proc,(Param *)local_138,(Param *)&local_168);
  local_138._8_8_ = (ulong)(uint7)local_138._9_7_ << 8;
  local_138._0_8_ = &PTR_getXn_00246bf0;
  md::Code::movew(&proc,0x1e,(Param *)local_138);
  md::Code::jsr(&proc,0x28fd8);
  md::Code::jmp(&proc,0x24b30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"not_archipelago",(allocator<char> *)&local_168);
  md::Code::label(&proc,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  md::Code::jsr(&proc,0x29232);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"jmp_to_24AF4",(allocator<char> *)&local_168);
  md::Code::bne(&proc,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  md::Code::jmp(&proc,0x24aea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"jmp_to_24AF4",(allocator<char> *)&local_168);
  md::Code::label(&proc,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  md::Code::jmp(&proc,0x24af4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"",(allocator<char> *)&local_168);
  address = md::ROM::inject_code(rom,&proc,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  local_118._M_left = &local_118;
  _Stack_f0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8 = 0;
  _Stack_f0._0_8_ = 0;
  local_118._M_color = _S_red;
  local_118._4_4_ = 0;
  local_118._M_parent = (_Base_ptr)0x0;
  local_138._16_8_ = 0;
  _uStack_120 = 0;
  local_138._0_8_ = (_func_int **)0x0;
  local_138._8_8_ = (pointer)0x0;
  _Stack_f0.super__Rb_tree_header._M_header._M_left = &_Stack_f0.super__Rb_tree_header._M_header;
  _Stack_f0.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_f0.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_f0.super__Rb_tree_header._M_node_count = 0;
  local_118._M_right = local_118._M_left;
  _Stack_f0.super__Rb_tree_header._M_header._M_right =
       _Stack_f0.super__Rb_tree_header._M_header._M_left;
  pCVar1 = md::Code::jmp((Code *)local_138,address);
  pCVar1 = md::Code::nop(pCVar1,1);
  md::ROM::set_code(rom,0x24ae4,pCVar1);
  md::Code::~Code((Code *)local_138);
  md::Code::~Code(&proc);
  return;
}

Assistant:

static void add_proc_handle_archipelago_items_on_ground(md::ROM& rom)
    {
        md::Code proc;
        {
            proc.cmpib(ITEM_ARCHIPELAGO, reg_D0);
            proc.bne("not_archipelago");
            {
                proc.trap(0x00, { 0x00, 0x05 });  // Play "get item" jingle

                // Update current ground item UUID
                proc.clrw(reg_D7);
                proc.moveb(addr_(reg_A5, 0x3A), reg_D7);  // Ground ID stored as dialogue
                proc.lsrb(2, reg_D7);                     //   / 4

                // Set the ground check flag manually since we skip the "GetItem" function
                proc.movem_to_stack({ reg_D0, reg_D7 }, { reg_A0 });
                proc.movel(reg_D7, reg_D0);
                proc.andib(0x07, reg_D7);      // D7 contains flag bit
                proc.lsrb(3, reg_D0);          // D0 contains flag byte
                proc.lea(0xFF1060, reg_A0);
                proc.bset(reg_D7, addr_(reg_A0, reg_D0));
                proc.movem_from_stack({ reg_D0, reg_D7 }, { reg_A0 });

                proc.addiw(0x200, reg_D7);                // add 0x200 to ground_item_id to get UUID
                proc.movew(reg_D7, addr_(ADDR_ARCHIPELAGO_CURRENT_LOCATION_UUID));

                proc.movew(0x1E, reg_D0); // "Sent {ITEM}"
                proc.jsr(0x28FD8);        // DisplayText
                proc.jmp(0x24B30);        // Return to normal flow not giving any item
            }
            proc.label("not_archipelago");
            // Item is regular, perform the checks as usual
            proc.jsr(0x29232); // GetRemainingItemAllowedCount
            proc.bne("jmp_to_24AF4");
            proc.jmp(0x24AEA);
            proc.label("jmp_to_24AF4");
            proc.jmp(0x24AF4);
        }

        uint32_t addr = rom.inject_code(proc);
        rom.set_code(0x24AE4, md::Code().jmp(addr).nop());
    }